

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  Allocator *pAVar4;
  undefined8 uVar5;
  int *piVar6;
  void *pvVar7;
  size_t sVar8;
  Mat *this_00;
  char cVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char cVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  size_t totalsize;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong __n;
  float *pfVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  Mat bottom_blob_bordered;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_g;
  long local_1a8;
  ulong local_198;
  Mat local_178;
  ulong local_138;
  undefined8 uStack_130;
  ulong local_120;
  Mat local_118;
  Mat *local_d8;
  ulong local_d0;
  long local_c8;
  int local_c0;
  uint local_bc;
  undefined1 local_b8 [44];
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  size_t local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Option local_58;
  
  uVar20._0_4_ = bottom_blob->h;
  uVar20._4_4_ = bottom_blob->c;
  if ((int)uVar20._4_4_ % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar11 = bottom_blob->w;
  local_178.elemsize = bottom_blob->elemsize;
  iVar2 = this->kernel_w;
  iVar22 = this->dilation_w;
  iVar18 = this->kernel_h;
  iVar10 = this->dilation_h;
  local_178.data = bottom_blob->data;
  local_178.refcount = bottom_blob->refcount;
  local_178.elempack = bottom_blob->elempack;
  local_178.allocator = bottom_blob->allocator;
  local_178.dims = bottom_blob->dims;
  local_178.w = bottom_blob->w;
  local_178._48_8_ = uVar20;
  local_178.cstep = bottom_blob->cstep;
  if (local_178.refcount != (int *)0x0) {
    LOCK();
    *local_178.refcount = *local_178.refcount + 1;
    UNLOCK();
  }
  local_d8 = top_blob;
  if ((pointer)local_178.elemsize != (pointer)0x1) {
    pAVar4 = opt->workspace_allocator;
    auVar27._0_4_ = -(uint)(local_178.dims == 3);
    auVar27._4_4_ = -(uint)(iVar11 == local_178.w);
    auVar27._8_4_ = 0xffffffff;
    auVar27._12_4_ = 0xffffffff;
    iVar16 = movmskps(local_178.refcount._0_4_,auVar27);
    if ((((iVar16 != 0xf) || (local_178.elempack != 1)) || (local_178.allocator != pAVar4)) ||
       ((pointer)local_178.elemsize != (pointer)0x1)) {
      uVar15 = uVar20;
      if (local_178.refcount != (int *)0x0) {
        LOCK();
        *local_178.refcount = *local_178.refcount + -1;
        UNLOCK();
        if (*local_178.refcount == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if (local_178.data != (void *)0x0) {
              uStack_130 = 0;
              local_138 = uVar20;
              free(local_178.data);
              uVar15 = local_138;
            }
          }
          else {
            uStack_130 = 0;
            local_138 = uVar20;
            (**(code **)(*(long *)local_178.allocator + 0x18))();
            uVar15 = local_138;
          }
        }
      }
      local_178.data = (void *)0x0;
      local_178.refcount._0_4_ = 0;
      local_178.refcount._4_4_ = 0;
      local_178.refcount = (int *)0x0;
      local_178.elemsize = 1;
      local_178.elempack = 1;
      local_178.w = iVar11;
      local_178.dims = 3;
      local_178.h = (int)uVar15;
      local_178.c = uVar20._4_4_;
      local_178.cstep = (long)((int)uVar15 * iVar11) + 0xfU & 0xfffffffffffffff0;
      uVar15 = (long)(int)uVar20._4_4_ * local_178.cstep;
      local_178.allocator = pAVar4;
      if (uVar15 != 0) {
        if (pAVar4 == (Allocator *)0x0) {
          local_118.data = (void *)0x0;
          iVar11 = posix_memalign(&local_118.data,0x10,uVar15 | 4);
          local_178.data = local_118.data;
          if (iVar11 != 0) {
            local_118.data = (void *)0x0;
            local_178.data = local_118.data;
          }
        }
        else {
          local_178.data = (void *)(**(code **)(*(long *)pAVar4 + 0x10))(pAVar4,uVar15 | 4);
        }
        local_178.refcount = (int *)((long)local_178.data + uVar15);
        *(undefined4 *)((long)local_178.data + uVar15) = 1;
      }
    }
    iVar11 = -100;
    if ((local_178.data == (void *)0x0) || ((long)local_178.c * local_178.cstep == 0))
    goto LAB_00158219;
    iVar11 = (int)uVar20._4_4_ / this->group;
    if (0 < this->group) {
      lVar19 = 0;
      lVar12 = 0;
      do {
        uVar5._0_1_ = opt->lightmode;
        uVar5._1_3_ = *(undefined3 *)&opt->field_0x1;
        uVar5._4_4_ = opt->num_threads;
        local_58.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
        local_58.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
        local_58.use_winograd_convolution = opt->use_winograd_convolution;
        local_58.use_sgemm_convolution = opt->use_sgemm_convolution;
        local_58.use_int8_inference = opt->use_int8_inference;
        local_58.use_vulkan_compute = opt->use_vulkan_compute;
        local_58.use_fp16_packed = opt->use_fp16_packed;
        local_58.use_fp16_storage = opt->use_fp16_storage;
        local_58.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        local_58.use_int8_storage = opt->use_int8_storage;
        local_58.use_int8_arithmetic = opt->use_int8_arithmetic;
        local_58.use_packing_layout = opt->use_packing_layout;
        local_58.use_shader_pack8 = opt->use_shader_pack8;
        local_58.use_bf16_storage = opt->use_bf16_storage;
        local_58._36_4_ = *(undefined4 *)&opt->field_0x24;
        local_58._0_4_ = SUB84(uVar5,0);
        local_58.num_threads = 1;
        local_58.blob_allocator = local_178.allocator;
        local_118.w = bottom_blob->w;
        local_118.elemsize = bottom_blob->elemsize;
        local_118.data =
             (void *)(bottom_blob->cstep * lVar19 * local_118.elemsize + (long)bottom_blob->data);
        local_118.h = bottom_blob->h;
        local_118.elempack = bottom_blob->elempack;
        local_118.allocator = bottom_blob->allocator;
        local_118.refcount._0_4_ = 0;
        local_118.refcount._4_4_ = 0;
        local_118.dims = 3;
        local_118.cstep =
             ((long)(local_118.h * local_118.w) * local_118.elemsize + 0xf & 0xfffffffffffffff0) /
             local_118.elemsize;
        local_b8._0_8_ = local_178.cstep * lVar19 * local_178.elemsize + (long)local_178.data;
        local_b8._8_4_ = 0;
        local_b8._12_4_ = 0;
        local_b8._16_8_ = local_178.elemsize;
        local_b8._24_4_ = local_178.elempack;
        local_b8._32_8_ = local_178.allocator;
        iStack_8c = local_178.w;
        local_b8._40_4_ = 3;
        iStack_88 = local_178.h;
        iStack_84 = iVar11;
        local_80 = ((long)(local_178.h * local_178.w) * local_178.elemsize + 0xf &
                   0xfffffffffffffff0) / local_178.elemsize;
        local_118.c = iVar11;
        quantize_float32_to_int8
                  (&local_118,(Mat *)local_b8,
                   *(float *)((long)(this->bottom_blob_int8_scales).data + lVar12 * 4),&local_58);
        piVar6 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
              if ((pointer)local_b8._0_8_ != (pointer)0x0) {
                free((void *)local_b8._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)local_b8._32_8_ + 0x18))();
            }
          }
        }
        local_b8._16_8_ = (pointer)0x0;
        local_b8._24_4_ = 0;
        local_b8._0_8_ = (pointer)0x0;
        local_b8._8_4_ = 0;
        local_b8._12_4_ = 0;
        stack0xffffffffffffff70 = (undefined1  [16])0x0;
        local_80 = 0;
        piVar6 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_118.allocator == (Allocator *)0x0) {
              if (local_118.data != (void *)0x0) {
                free(local_118.data);
              }
            }
            else {
              (**(code **)(*(long *)local_118.allocator + 0x18))();
            }
          }
        }
        lVar12 = lVar12 + 1;
        lVar19 = lVar19 + iVar11;
      } while (lVar12 < this->group);
    }
  }
  local_118.elemsize = 0;
  local_118.elempack = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.c = 0;
  local_118.cstep = 0;
  make_padding(this,&local_178,&local_118,opt);
  this_00 = local_d8;
  iVar16 = local_118.w;
  iVar11 = -100;
  if ((local_118.data != (void *)0x0) && ((long)local_118.c * local_118.cstep != 0)) {
    iVar2 = (~((iVar2 + -1) * iVar22) + local_118.w) / this->stride_w;
    uVar15 = (long)(~((iVar18 + -1) * iVar10) + local_118.h) / (long)this->stride_h;
    __n = (long)this->kernel_h * (long)this->kernel_w;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_b8,__n,(allocator_type *)&local_58);
    uVar5 = local_b8._0_8_;
    if (0 < this->kernel_h) {
      iVar11 = this->dilation_h;
      iVar22 = this->dilation_w;
      iVar18 = this->kernel_w;
      iVar10 = 0;
      iVar14 = 0;
      iVar17 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar19 = 0;
          do {
            *(int *)(local_b8._0_8_ + (iVar10 + lVar19) * 4) = iVar14;
            iVar14 = iVar14 + this->dilation_w;
            lVar19 = lVar19 + 1;
          } while ((int)lVar19 < this->kernel_w);
          iVar10 = iVar10 + (int)lVar19;
        }
        iVar14 = iVar14 + (iVar16 * iVar11 - iVar22 * iVar18);
        iVar17 = iVar17 + 1;
      } while (iVar17 < this->kernel_h);
    }
    local_120 = uVar15 & 0xffffffff;
    Mat::create(this_00,iVar2 + 1,(int)uVar15 + 1,this->num_output,
                ((ulong)this->use_int8_requantize ^ 1) * 3 + 1,opt->blob_allocator);
    iVar11 = -100;
    if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
      iVar11 = this->group;
      iVar22 = (int)__n;
      if (iVar11 == this->num_output && uVar20._4_4_ == iVar11) {
        if (0 < this->group) {
          local_d0 = (ulong)iVar22;
          local_198 = 0;
          uVar20 = 0;
          do {
            sVar8 = local_118.elemsize;
            pvVar7 = local_118.data;
            if (-1 < (int)local_120) {
              lVar19 = local_118.cstep * uVar20 * local_118.elemsize;
              pfVar23 = (float *)(local_d8->cstep * uVar20 * local_d8->elemsize +
                                 (long)local_d8->data);
              local_c8 = CONCAT44(local_c8._4_4_,local_118.w);
              pvVar3 = (this->weight_data).data;
              local_138 = uVar20;
              iVar11 = 0;
              do {
                if (-1 < iVar2) {
                  iVar10 = iVar11 * (int)local_c8;
                  iVar18 = 0;
                  do {
                    if (iVar22 < 1) {
                      fVar26 = 0.0;
                    }
                    else {
                      uVar15 = 0;
                      iVar16 = 0;
                      do {
                        iVar16 = iVar16 + (int)*(char *)((long)pvVar3 + uVar15 + local_198) *
                                          (int)*(char *)((long)pvVar7 +
                                                        (long)*(int *)(uVar5 + uVar15 * 4) +
                                                        (long)(this->stride_h * iVar10) * sVar8 +
                                                        (long)iVar18 * (long)this->stride_w + lVar19
                                                        );
                        uVar15 = uVar15 + 1;
                      } while ((__n & 0xffffffff) != uVar15);
                      fVar26 = (float)iVar16;
                    }
                    if (this->use_int8_requantize == false) {
                      fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + uVar20 * 4);
                      fVar25 = 0.0;
                      if (fVar1 != 0.0) {
                        fVar25 = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales).
                                                                 data + uVar20 * 4));
                      }
                      fVar25 = fVar25 * fVar26;
                      if (this->bias_term != 0) {
                        fVar25 = fVar25 + *(float *)((long)(this->bias_data).data + uVar20 * 4);
                      }
                      fVar26 = 0.0;
                      if (0.0 <= fVar25) {
                        fVar26 = fVar25;
                      }
                      if (this->activation_type != 1) {
                        fVar26 = fVar25;
                      }
                      *pfVar23 = fVar26;
                      lVar12 = 4;
                    }
                    else {
                      fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + uVar20 * 4);
                      fVar25 = 0.0;
                      if (fVar1 != 0.0) {
                        fVar25 = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales).
                                                                 data + uVar20 * 4));
                      }
                      fVar25 = fVar25 * fVar26;
                      if (this->bias_term != 0) {
                        fVar25 = fVar25 + *(float *)((long)(this->bias_data).data + uVar20 * 4);
                      }
                      fVar26 = roundf(fVar25 * this->top_blob_int8_scale);
                      iVar16 = (int)fVar26;
                      if (iVar16 < -0x7e) {
                        iVar16 = -0x7f;
                      }
                      if (0x7e < iVar16) {
                        iVar16 = 0x7f;
                      }
                      cVar9 = (char)iVar16;
                      cVar13 = '\0';
                      if ('\0' < cVar9) {
                        cVar13 = cVar9;
                      }
                      if (this->activation_type != 1) {
                        cVar13 = cVar9;
                      }
                      *(char *)pfVar23 = cVar13;
                      lVar12 = 1;
                      uVar20 = local_138;
                    }
                    pfVar23 = (float *)((long)pfVar23 + lVar12);
                    bVar24 = iVar18 != iVar2;
                    iVar18 = iVar18 + 1;
                  } while (bVar24);
                }
                bVar24 = iVar11 != (int)local_120;
                iVar11 = iVar11 + 1;
              } while (bVar24);
            }
            uVar20 = uVar20 + 1;
            local_198 = local_198 + local_d0;
          } while ((long)uVar20 < (long)this->group);
        }
      }
      else {
        uVar15 = (long)this->num_output / (long)iVar11;
        uVar21 = uVar15 & 0xffffffff;
        if (0 < this->group) {
          iVar18 = (int)((long)(int)uVar20._4_4_ / (long)iVar11);
          local_bc = (uint)uVar15;
          local_c0 = local_bc * iVar18 * iVar22;
          local_70 = (long)(iVar18 * iVar22);
          local_78 = (long)(int)local_bc;
          local_d0 = uVar15 & 0xffffffff;
          local_1a8 = 0;
          do {
            if (0 < (int)uVar21) {
              local_60 = local_1a8 * local_78;
              local_68 = (long)(local_c0 * (int)local_1a8);
              local_198 = 0;
              do {
                if (-1 < (int)local_120) {
                  lVar19 = local_198 + local_60;
                  pfVar23 = (float *)(local_d8->cstep * lVar19 * local_d8->elemsize +
                                     (long)local_d8->data);
                  local_c8 = (long)(this->weight_data).data + local_198 * local_70 + local_68;
                  local_138 = 0;
                  do {
                    if (-1 < iVar2) {
                      iVar10 = 0;
                      do {
                        if (iVar18 < 1) {
                          fVar26 = 0.0;
                        }
                        else {
                          uVar15 = 0;
                          iVar16 = 0;
                          lVar12 = local_c8;
                          do {
                            if (0 < iVar22) {
                              uVar21 = 0;
                              do {
                                iVar16 = iVar16 + (int)*(char *)(lVar12 + uVar21) *
                                                  (int)*(char *)((long)local_118.data +
                                                                (long)*(int *)(uVar5 + uVar21 * 4) +
                                                                (uVar15 + (uint)(iVar18 * (int)
                                                  local_1a8)) * local_118.cstep * local_118.elemsize
                                                  + (long)iVar10 * (long)this->stride_w +
                                                    (long)(local_118.w * (int)local_138 *
                                                          this->stride_h) * local_118.elemsize);
                                uVar21 = uVar21 + 1;
                              } while ((__n & 0xffffffff) != uVar21);
                            }
                            lVar12 = lVar12 + __n;
                            uVar15 = uVar15 + 1;
                          } while (uVar15 != ((long)(int)uVar20._4_4_ / (long)iVar11 & 0xffffffffU))
                          ;
                          fVar26 = (float)iVar16;
                        }
                        if (this->use_int8_requantize == false) {
                          fVar1 = *(float *)((long)(this->weight_data_int8_scales).data +
                                            local_1a8 * 4);
                          fVar25 = 0.0;
                          if (fVar1 != 0.0) {
                            fVar25 = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales)
                                                                     .data + local_1a8 * 4));
                          }
                          fVar25 = fVar25 * fVar26;
                          if (this->bias_term != 0) {
                            fVar25 = fVar25 + *(float *)((long)(this->bias_data).data + lVar19 * 4);
                          }
                          fVar26 = 0.0;
                          if (0.0 <= fVar25) {
                            fVar26 = fVar25;
                          }
                          if (this->activation_type != 1) {
                            fVar26 = fVar25;
                          }
                          *pfVar23 = fVar26;
                          lVar12 = 4;
                        }
                        else {
                          fVar1 = *(float *)((long)(this->weight_data_int8_scales).data +
                                            local_1a8 * 4);
                          fVar25 = 0.0;
                          if (fVar1 != 0.0) {
                            fVar25 = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales)
                                                                     .data + local_1a8 * 4));
                          }
                          fVar25 = fVar25 * fVar26;
                          if (this->bias_term != 0) {
                            fVar25 = fVar25 + *(float *)((long)(this->bias_data).data + lVar19 * 4);
                          }
                          fVar26 = roundf(fVar25 * this->top_blob_int8_scale);
                          iVar16 = (int)fVar26;
                          if (iVar16 < -0x7e) {
                            iVar16 = -0x7f;
                          }
                          if (0x7e < iVar16) {
                            iVar16 = 0x7f;
                          }
                          cVar9 = (char)iVar16;
                          cVar13 = '\0';
                          if ('\0' < cVar9) {
                            cVar13 = cVar9;
                          }
                          if (this->activation_type != 1) {
                            cVar13 = cVar9;
                          }
                          *(char *)pfVar23 = cVar13;
                          lVar12 = 1;
                        }
                        pfVar23 = (float *)((long)pfVar23 + lVar12);
                        bVar24 = iVar10 != iVar2;
                        iVar10 = iVar10 + 1;
                      } while (bVar24);
                    }
                    iVar10 = (int)local_138;
                    local_138 = (ulong)(iVar10 + 1);
                  } while (iVar10 != (int)local_120);
                }
                local_198 = local_198 + 1;
              } while (local_198 != local_d0);
            }
            local_1a8 = local_1a8 + 1;
            uVar21 = (ulong)local_bc;
          } while (local_1a8 < this->group);
        }
      }
      iVar11 = 0;
    }
    if ((pointer)local_b8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
    }
  }
  piVar6 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (**(code **)(*(long *)local_118.allocator + 0x18))();
      }
    }
  }
LAB_00158219:
  if (local_178.refcount != (int *)0x0) {
    LOCK();
    *local_178.refcount = *local_178.refcount + -1;
    UNLOCK();
    if (*local_178.refcount == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (**(code **)(*(long *)local_178.allocator + 0x18))();
      }
    }
  }
  return iVar11;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        bottom_blob_unbordered.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_unbordered.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_unbordered.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_unbordered.channel_range(channels_g * g, channels_g);

            quantize_float32_to_int8(bottom_blob_g, bottom_blob_int8_g, bottom_blob_int8_scales[g], opt_g);
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[ space_ofs[k] ];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    if (use_int8_requantize)
                    {
                        // requantize and relu
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g];

                        float scale_out = top_blob_int8_scale;//FIXME load param

                        signed char sums8 = float2int8(sumfp32 * scale_out);

                        if (activation_type == 1)
                        {
                            sums8 = std::max(sums8, (signed char)0);
                        }

                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize and relu
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g];

                        if (activation_type == 1)
                        {
                            sumfp32 = std::max(sumfp32, 0.f);
                        }

                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g=0; g<group; g++)
        {
            for (int p=0; p<num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q=0; q<channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[ space_ofs[k] ];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        if (use_int8_requantize)
                        {
                            // requantize and relu
                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g * num_output_g + p];

                            float scale_out = top_blob_int8_scale;//FIXME load param

                            signed char sums8 = float2int8(sumfp32 * scale_out);

                            if (activation_type == 1)
                            {
                                sums8 = std::max(sums8, (signed char)0);
                            }

                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize and relu
                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g * num_output_g + p];

                            if (activation_type == 1)
                            {
                                sumfp32 = std::max(sumfp32, 0.f);
                            }

                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}